

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

int __thiscall iqnet::Socket::listen(Socket *this,int __fd,int __n)

{
  int iVar1;
  network_error *this_00;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Socket *pSStack_10;
  uint blog_local;
  Socket *this_local;
  
  local_14 = __fd;
  pSStack_10 = this;
  iVar1 = ::listen(this->sock,__fd);
  if (iVar1 == -1) {
    this_00 = (network_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Socket::listen",&local_39);
    network_error::network_error(this_00,&local_38,true,0);
    __cxa_throw(this_00,&network_error::typeinfo,network_error::~network_error);
  }
  return iVar1;
}

Assistant:

void Socket::listen( unsigned blog )
{
  if( ::listen( sock, blog ) == -1 )
    throw network_error( "Socket::listen" );
}